

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O3

transfers_state_t parse_transfer_state(char *value)

{
  char cVar1;
  
  cVar1 = *value;
  if (cVar1 == '2') {
    if (value[1] == '\0') {
      return TS_TWICE;
    }
  }
  else if (cVar1 == '1') {
    if (value[1] == '\0') {
      return TS_ONCE;
    }
  }
  else if ((cVar1 == '0') && (value[1] == '\0')) {
    return TS_NOT_ALLOWED;
  }
  return (uint)(cVar1 == '\0') * 3;
}

Assistant:

transfers_state_t parse_transfer_state(const char *value) {
    if (strcmp(value, "0") == 0)
        return TS_NOT_ALLOWED;
    else if (strcmp(value, "1") == 0)
        return TS_ONCE;
    else if (strcmp(value, "2") == 0)
        return TS_TWICE;
    else if (strcmp(value, "") == 0)
        return TS_UNLIMITED;
    else
        return TS_NOT_ALLOWED;
}